

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
          (MessageBuilderLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  ClassNameResolver *pCVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  long lVar7;
  long lVar8;
  OneofDescriptor *local_70;
  LogMessage local_68;
  
  this->_vptr_MessageBuilderLiteGenerator = (_func_int **)&PTR__MessageBuilderLiteGenerator_004df7b0
  ;
  this->descriptor_ = descriptor;
  this->context_ = context;
  pCVar4 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar4;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(&this->field_generators_,descriptor,this->context_);
  p_Var1 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((context->options_).enforce_lite == false) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder_lite.cc"
               ,0x43);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: !HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,
                        "Generator factory error: A lite message generator is used to generate non-lite messages."
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pDVar6 = this->descriptor_;
  if (0 < *(int *)(pDVar6 + 4)) {
    lVar8 = 0x28;
    lVar7 = 0;
    do {
      lVar2 = *(long *)(pDVar6 + 0x28);
      lVar3 = *(long *)(lVar2 + lVar8);
      if ((lVar3 != 0 && (*(byte *)(lVar2 + -0x27 + lVar8) & 0x10) != 0) &&
         ((*(int *)(lVar3 + 4) != 1 || ((*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) == 0)))) {
        if ((*(byte *)(lVar2 + -0x27 + lVar8) & 0x10) == 0) {
          local_70 = (OneofDescriptor *)0x0;
        }
        else {
          local_70 = *(OneofDescriptor **)(lVar2 + lVar8);
        }
        std::
        _Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::OneofDescriptor_const*>
                  ((_Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
                    *)&this->oneofs_,&local_70);
      }
      lVar7 = lVar7 + 1;
      pDVar6 = this->descriptor_;
      lVar8 = lVar8 + 0x48;
    } while (lVar7 < *(int *)(pDVar6 + 4));
  }
  return;
}

Assistant:

MessageBuilderLiteGenerator::MessageBuilderLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      oneofs_.insert(descriptor_->field(i)->containing_oneof());
    }
  }
}